

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVP.cpp
# Opt level: O3

void __thiscall MT32Emu::TVP::process(TVP *this)

{
  PartialParam *pPVar1;
  bool bVar2;
  byte bVar3;
  Bit16u BVar4;
  short sVar5;
  Bit32s BVar6;
  int iVar7;
  ControlROMPCMStruct *pCVar8;
  Synth *pSVar9;
  TVA *this_00;
  Poly *this_01;
  int iVar10;
  uint uVar11;
  uint uVar12;
  
  iVar10 = this->phase;
  if (iVar10 == 5) {
    iVar7 = this->phase + 1;
    this->phase = iVar7;
    iVar10 = 4;
    if (iVar7 != 6) {
      iVar10 = iVar7;
    }
    pPVar1 = this->partialParam;
    this_01 = Partial::getPoly(this->partial);
    uVar12 = Poly::getVelocity(this_01);
    BVar6 = calcTargetPitchOffsetWithoutLFO(pPVar1,iVar10,uVar12);
    this->targetPitchOffsetWithoutLFO = BVar6;
    uVar12 = (uint)(this->partialParam->pitchEnv).time[(long)iVar10 + -1];
    iVar10 = uVar12 - (int)this->timeKeyfollowSubtraction;
    if (iVar10 != 0 && (int)this->timeKeyfollowSubtraction <= (int)uVar12) {
      setupPitchChange(this,BVar6,(Bit8u)iVar10);
      updatePitch(this);
      return;
    }
    targetPitchOffsetReached(this);
    return;
  }
  if (iVar10 == 0) {
code_r0x00184544:
    this->currentPitchOffset = (int)this->lfoPitchOffset + this->targetPitchOffsetWithoutLFO;
    if (this->phase - 3U < 2) {
      bVar3 = Part::getModulation(this->part);
      pPVar1 = this->partialParam;
      iVar7 = (uint)(pPVar1->pitchLFO).depth +
              ((uint)(pPVar1->pitchLFO).modSensitivity * (uint)bVar3 >> 7);
      iVar10 = iVar7 * -2;
      if (this->pitchOffsetChangePerBigTick < 1) {
        iVar10 = iVar7 * 2;
      }
      this->lfoPitchOffset = (Bit16s)iVar10;
      setupPitchChange(this,iVar10 + this->targetPitchOffsetWithoutLFO,'e' - (pPVar1->pitchLFO).rate
                      );
    }
    else if (this->phase != 6) {
      nextPhase(this);
      return;
    }
    updatePitch(this);
    return;
  }
  if (iVar10 < 8) {
    sVar5 = *(short *)((long)&this->timeElapsed + 1) - this->targetPitchOffsetReachedBigTick;
    if (sVar5 < 0) {
      uVar12 = this->shifts;
      uVar11 = 0xd;
      if ((int)uVar12 < 0xd) {
        uVar11 = uVar12;
      }
      if (0xd < (int)uVar12) {
        sVar5 = (short)((int)sVar5 >> ((char)uVar12 + 0x13U & 0x1f));
      }
      this->currentPitchOffset =
           (int)this->lfoPitchOffset + this->targetPitchOffsetWithoutLFO +
           ((int)this->pitchOffsetChangePerBigTick * (int)sVar5 >> ((byte)uVar11 & 0x1f));
      updatePitch(this);
      return;
    }
    goto code_r0x00184544;
  }
  uVar12 = this->currentPitchOffset + this->basePitch;
  bVar2 = Partial::isPCM(this->partial);
  if (bVar2) {
    pCVar8 = Partial::getControlROMPCMStruct(this->partial);
    if ((pCVar8->len & 1) != 0) goto LAB_001844ec;
  }
  pSVar9 = Partial::getSynth(this->partial);
  BVar6 = Synth::getMasterTunePitchDelta(pSVar9);
  uVar12 = uVar12 + BVar6;
LAB_001844ec:
  if (((this->partialParam->wg).pitchBenderEnabled & 1) != 0) {
    BVar6 = Part::getPitchBend(this->part);
    uVar12 = uVar12 + BVar6;
  }
  pSVar9 = Partial::getSynth(this->partial);
  uVar11 = 0;
  if (0 < (int)uVar12) {
    uVar11 = uVar12;
  }
  uVar12 = uVar12 & 0xffff;
  if (((uint)*pSVar9->controlROMFeatures & 2) == 0) {
    uVar12 = uVar11;
  }
  BVar4 = (Bit16u)uVar12;
  if (0xe7ff < uVar12) {
    BVar4 = 0xe800;
  }
  this->pitch = BVar4;
  this_00 = Partial::getTVA(this->partial);
  TVA::recalcSustain(this_00);
  return;
}

Assistant:

void TVP::process() {
	if (phase == 0) {
		targetPitchOffsetReached();
		return;
	}
	if (phase == 5) {
		nextPhase();
		return;
	}
	if (phase > 7) {
		updatePitch();
		return;
	}

	Bit16s negativeBigTicksRemaining = (timeElapsed >> 8) - targetPitchOffsetReachedBigTick;
	if (negativeBigTicksRemaining >= 0) {
		// We've reached the time for a phase change
		targetPitchOffsetReached();
		return;
	}
	// FIXME: Write explanation for this stuff
	// NOTE: Value of shifts may happily exceed the maximum of 31 specified for the 8095 MCU.
	// We assume the device performs a shift with the rightmost 5 bits of the counter regardless of argument size,
	// since shift instructions of any size have the same maximum.
	int rightShifts = shifts;
	if (rightShifts > 13) {
		rightShifts -= 13;
		negativeBigTicksRemaining = negativeBigTicksRemaining >> (rightShifts & 0x1F); // PORTABILITY NOTE: Assumes arithmetic shift
		rightShifts = 13;
	}
	int newResult = (negativeBigTicksRemaining * pitchOffsetChangePerBigTick) >> (rightShifts & 0x1F); // PORTABILITY NOTE: Assumes arithmetic shift
	newResult += targetPitchOffsetWithoutLFO + lfoPitchOffset;
	currentPitchOffset = newResult;
	updatePitch();
}